

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SignedCastExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SignedCastExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ParenthesizedExpressionSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,ParenthesizedExpressionSyntax *args_2)

{
  Token apostrophe;
  Token signing;
  SignedCastExpressionSyntax *pSVar1;
  Info *in_RCX;
  long in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pSVar1 = (SignedCastExpressionSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  signing.info = in_RSI;
  signing.kind = (short)in_RDX;
  signing._2_1_ = (char)((ulong)in_RDX >> 0x10);
  signing.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  signing.rawLen = (int)((ulong)in_RDX >> 0x20);
  apostrophe.info = in_RCX;
  apostrophe._0_8_ = in_RSI->location;
  slang::syntax::SignedCastExpressionSyntax::SignedCastExpressionSyntax
            ((SignedCastExpressionSyntax *)in_RSI->rawTextPtr,signing,apostrophe,
             *(ParenthesizedExpressionSyntax **)(in_RDX + 8));
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }